

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CWorker.hpp
# Opt level: O0

void __thiscall sftm::CWorker::WorkUntil(CWorker *this,CChainController *chainController)

{
  bool bVar1;
  CTask *pTask_00;
  CTask *pTask;
  CChainController *chainController_local;
  CWorker *this_local;
  
  do {
    bVar1 = CChainController::IsFinished(chainController);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    do {
      while (pTask_00 = PopTask(this), pTask_00 != (CTask *)0x0) {
        ExecuteTask(this,pTask_00);
        bVar1 = CChainController::IsFinished(chainController);
        if (bVar1) {
          return;
        }
      }
      bVar1 = FindWork(this);
    } while (bVar1);
  } while( true );
}

Assistant:

void WorkUntil(CChainController& chainController) noexcept
		{
			while (!chainController.IsFinished())
			{
				do
				{
					while (CTask* pTask = PopTask())
					{
						ExecuteTask(pTask);

						if (chainController.IsFinished())
							return;
					}
				} while (FindWork());
			}
		}